

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

bool __thiscall cmArchiveWrite::AddData(cmArchiveWrite *this,char *file,size_t size)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  long lVar3;
  size_t sVar4;
  size_t local_4460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4440;
  cmAlphaNum local_4420;
  cmAlphaNum local_43f0;
  string local_43c0;
  string local_43a0;
  cmAlphaNum local_4380;
  cmAlphaNum local_4350;
  string local_4320;
  size_t local_4300;
  ssize_type nnext_s;
  size_t nnext;
  size_t nleft;
  char buffer [16384];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  cmAlphaNum local_2c0;
  cmAlphaNum local_290;
  string local_260;
  long local_230;
  ifstream fin;
  size_t size_local;
  char *file_local;
  cmArchiveWrite *this_local;
  
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&local_230,file,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
  sVar4 = size;
  if ((bVar1 & 1) == 0) {
    while (nnext = sVar4, nnext != 0) {
      if (nnext < 0x4001) {
        local_4460 = nnext;
      }
      else {
        local_4460 = 0x4000;
      }
      nnext_s = local_4460;
      local_4300 = local_4460;
      std::istream::read((char *)&local_230,(long)&nleft);
      lVar3 = std::istream::gcount();
      if (lVar3 != nnext_s) break;
      sVar4 = archive_write_data(this->Archive,&nleft,nnext_s);
      if (sVar4 != local_4300) {
        cmAlphaNum::cmAlphaNum(&local_4350,"archive_write_data: ");
        cm_archive_error_string_abi_cxx11_(&local_43a0,this->Archive);
        cmAlphaNum::cmAlphaNum(&local_4380,&local_43a0);
        cmStrCat<>(&local_4320,&local_4350,&local_4380);
        std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_4320);
        std::__cxx11::string::~string((string *)&local_4320);
        std::__cxx11::string::~string((string *)&local_43a0);
        this_local._7_1_ = false;
        goto LAB_00545325;
      }
      sVar4 = nnext - nnext_s;
    }
    if (nnext == 0) {
      this_local._7_1_ = true;
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_43f0,"Error reading \"");
      cmAlphaNum::cmAlphaNum(&local_4420,file);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      cmStrCat<char[4],std::__cxx11::string>
                (&local_43c0,&local_43f0,&local_4420,(char (*) [4])0xc1f2db,&local_4440);
      std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_43c0);
      std::__cxx11::string::~string((string *)&local_43c0);
      std::__cxx11::string::~string((string *)&local_4440);
      this_local._7_1_ = false;
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_290,"Error opening \"");
    cmAlphaNum::cmAlphaNum(&local_2c0,file);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    cmStrCat<char[4],std::__cxx11::string>
              (&local_260,&local_290,&local_2c0,(char (*) [4])0xc1f2db,&local_2e0);
    std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_2e0);
    this_local._7_1_ = false;
  }
LAB_00545325:
  buffer[0x3ffc] = '\x01';
  buffer[0x3ffd] = '\0';
  buffer[0x3ffe] = '\0';
  buffer[0x3fff] = '\0';
  std::ifstream::~ifstream(&local_230);
  return this_local._7_1_;
}

Assistant:

bool cmArchiveWrite::AddData(const char* file, size_t size)
{
  cmsys::ifstream fin(file, std::ios::in | std::ios::binary);
  if (!fin) {
    this->Error = cmStrCat("Error opening \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }

  char buffer[16384];
  size_t nleft = size;
  while (nleft > 0) {
    using ssize_type = std::streamsize;
    size_t const nnext = nleft > sizeof(buffer) ? sizeof(buffer) : nleft;
    ssize_type const nnext_s = static_cast<ssize_type>(nnext);
    fin.read(buffer, nnext_s);
    // Some stream libraries (older HPUX) return failure at end of
    // file on the last read even if some data were read.  Check
    // gcount instead of trusting the stream error status.
    if (static_cast<size_t>(fin.gcount()) != nnext) {
      break;
    }
    if (archive_write_data(this->Archive, buffer, nnext) != nnext_s) {
      this->Error = cmStrCat("archive_write_data: ",
                             cm_archive_error_string(this->Archive));
      return false;
    }
    nleft -= nnext;
  }
  if (nleft > 0) {
    this->Error = cmStrCat("Error reading \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }
  return true;
}